

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O2

FBaseCVar * GetUserCVar(int playernum,char *cvarname)

{
  FBaseCVar *pFVar1;
  FBaseCVar **ppFVar2;
  FName local_c;
  
  if (7 < (uint)playernum) {
    return (FBaseCVar *)0x0;
  }
  if (playeringame[(uint)playernum] == true) {
    local_c.Index = FName::NameManager::FindName(&FName::NameData,cvarname,true);
    ppFVar2 = TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::CheckKey
                        ((TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_> *
                         )(&DAT_009ba458 + (ulong)(uint)playernum * 0x2a0),&local_c);
    if ((ppFVar2 != (FBaseCVar **)0x0) && (pFVar1 = *ppFVar2, pFVar1 != (FBaseCVar *)0x0)) {
      if ((pFVar1->Flags & 0x4000) != 0) {
        return (FBaseCVar *)0x0;
      }
      return pFVar1;
    }
  }
  return (FBaseCVar *)0x0;
}

Assistant:

FBaseCVar *GetUserCVar(int playernum, const char *cvarname)
{
	if ((unsigned)playernum >= MAXPLAYERS || !playeringame[playernum])
	{
		return nullptr;
	}
	FBaseCVar **cvar_p = players[playernum].userinfo.CheckKey(FName(cvarname, true));
	FBaseCVar *cvar;
	if (cvar_p == nullptr || (cvar = *cvar_p) == nullptr || (cvar->GetFlags() & CVAR_IGNORE))
	{
		return nullptr;
	}
	return cvar;
}